

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

unique_ptr<Parser,_std::default_delete<Parser>_> DefaultParser(void)

{
  _Rb_tree_header *p_Var1;
  Parser *this;
  __uniq_ptr_data<Parser,_std::default_delete<Parser>,_true,_true> in_RDI;
  
  this = (Parser *)operator_new(0x30);
  p_Var1 = &(this->operations_)._M_t._M_impl.super__Rb_tree_header;
  (this->operations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->operations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (this->operations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->operations_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->operations_)._M_t._M_impl = 0;
  *(undefined8 *)&(this->operations_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->operations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->operations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->operations_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(Parser **)
   in_RDI.super___uniq_ptr_impl<Parser,_std::default_delete<Parser>_>._M_t.
   super__Tuple_impl<0UL,_Parser_*,_std::default_delete<Parser>_>.
   super__Head_base<0UL,_Parser_*,_false>._M_head_impl = this;
  Parser::Register<AddOp>(this);
  Parser::Register<MulOp>
            (*(Parser **)
              in_RDI.super___uniq_ptr_impl<Parser,_std::default_delete<Parser>_>._M_t.
              super__Tuple_impl<0UL,_Parser_*,_std::default_delete<Parser>_>.
              super__Head_base<0UL,_Parser_*,_false>._M_head_impl);
  Parser::Register<SubOp>
            (*(Parser **)
              in_RDI.super___uniq_ptr_impl<Parser,_std::default_delete<Parser>_>._M_t.
              super__Tuple_impl<0UL,_Parser_*,_std::default_delete<Parser>_>.
              super__Head_base<0UL,_Parser_*,_false>._M_head_impl);
  Parser::Register<DivOp>
            (*(Parser **)
              in_RDI.super___uniq_ptr_impl<Parser,_std::default_delete<Parser>_>._M_t.
              super__Tuple_impl<0UL,_Parser_*,_std::default_delete<Parser>_>.
              super__Head_base<0UL,_Parser_*,_false>._M_head_impl);
  return (__uniq_ptr_data<Parser,_std::default_delete<Parser>,_true,_true>)
         (tuple<Parser_*,_std::default_delete<Parser>_>)
         in_RDI.super___uniq_ptr_impl<Parser,_std::default_delete<Parser>_>._M_t.
         super__Tuple_impl<0UL,_Parser_*,_std::default_delete<Parser>_>.
         super__Head_base<0UL,_Parser_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<Parser> DefaultParser() {
  auto p = std::make_unique<Parser>();
  p->Register<AddOp>();
  p->Register<MulOp>();
  p->Register<SubOp>();
  p->Register<DivOp>();
  return p;
}